

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

Expr * __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<TestNLHandler>>
::ReadSymbolicExpr_abi_cxx11_
          (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler>_>
           *this)

{
  StringRef value;
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Expr *in_RSI;
  NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler>_>
  *in_RDI;
  Expr else_expr;
  Expr then_expr;
  LogicalExpr condition;
  int opcode;
  char c;
  int in_stack_00000194;
  NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler>_>
  *in_stack_00000198;
  NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler>_>
  *this_00;
  undefined4 in_stack_fffffffffffffef8;
  LogicalExpr *in_stack_ffffffffffffff00;
  NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler>_>
  *in_stack_ffffffffffffff08;
  string local_e0 [32];
  string local_c0 [6];
  undefined1 in_stack_ffffffffffffff46;
  char in_stack_ffffffffffffff47;
  NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler>_>
  *in_stack_ffffffffffffff48;
  string local_a0 [48];
  string local_70 [32];
  string local_50 [36];
  int local_2c;
  StringRef local_28;
  undefined7 in_stack_ffffffffffffffe8;
  
  this_00 = in_RDI;
  cVar1 = ReaderBase::ReadChar(*(ReaderBase **)in_RSI);
  iVar2 = (int)cVar1;
  if (iVar2 == 0x68) {
    local_28 = BinaryReader<mp::internal::EndiannessConverter>::ReadString
                         ((BinaryReader<mp::internal::EndiannessConverter> *)in_RDI);
    value.size_._0_4_ = in_stack_fffffffffffffef8;
    value.data_ = (char *)in_RSI;
    value.size_._4_4_ = iVar2;
    NLHandler<mp::NullNLHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::OnString((NLHandler<mp::NullNLHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this_00,value);
  }
  else if (iVar2 == 0x6f) {
    iVar3 = NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler>_>
            ::ReadOpCode(in_RDI);
    local_2c = iVar3;
    iVar4 = mp::expr::nl_opcode((Kind)((ulong)in_RDI >> 0x20));
    if (iVar3 == iVar4) {
      ReadLogicalExpr_abi_cxx11_(in_stack_ffffffffffffff08);
      ReadSymbolicExpr_abi_cxx11_
                ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler>_>
                  *)CONCAT17(cVar1,in_stack_ffffffffffffffe8));
      ReadSymbolicExpr_abi_cxx11_
                ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler>_>
                  *)CONCAT17(cVar1,in_stack_ffffffffffffffe8));
      std::__cxx11::string::string(local_c0,local_50);
      std::__cxx11::string::string(local_e0,local_70);
      std::__cxx11::string::string((string *)&stack0xffffffffffffff00,local_a0);
      NLHandler<mp::NullNLHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::OnSymbolicIf((NLHandler<mp::NullNLHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                     (Expr *)CONCAT44(iVar2,in_stack_fffffffffffffef8),in_RSI);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff00);
      std::__cxx11::string::~string(local_e0);
      std::__cxx11::string::~string(local_c0);
      std::__cxx11::string::~string(local_a0);
      std::__cxx11::string::~string(local_70);
      std::__cxx11::string::~string(local_50);
    }
    else {
      ReadNumericExpr_abi_cxx11_(in_stack_00000198,in_stack_00000194);
    }
  }
  else {
    ReadNumericExpr_abi_cxx11_
              (in_stack_ffffffffffffff48,in_stack_ffffffffffffff47,(bool)in_stack_ffffffffffffff46);
  }
  return (Expr *)this_00;
}

Assistant:

typename Handler::Expr NLReader<Reader, Handler>::ReadSymbolicExpr() {
  char c = reader_.ReadChar();
  switch (c) {
  case 'h':
    return handler_.OnString(reader_.ReadString());
  case 'o': {
    int opcode = ReadOpCode();
    if (opcode != expr::nl_opcode(expr::IFSYM))
      return ReadNumericExpr(opcode);
    // Read symbolic if expression.
    LogicalExpr condition = ReadLogicalExpr();
    Expr then_expr = ReadSymbolicExpr();
    Expr else_expr = ReadSymbolicExpr();
    return handler_.OnSymbolicIf(condition, then_expr, else_expr);
  }
  }
  return ReadNumericExpr(c, false);
}